

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O0

CURLcode sasl_create_login_message(SessionHandle *data,char *valuep,char **outptr,size_t *outlen)

{
  size_t insize;
  char *pcVar1;
  size_t vlen;
  size_t *outlen_local;
  char **outptr_local;
  char *valuep_local;
  SessionHandle *data_local;
  
  insize = strlen(valuep);
  if (insize == 0) {
    pcVar1 = (*Curl_cstrdup)("=");
    *outptr = pcVar1;
    if (*outptr == (char *)0x0) {
      *outlen = 0;
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      *outlen = 1;
      data_local._4_4_ = CURLE_OK;
    }
  }
  else {
    data_local._4_4_ = Curl_base64_encode(data,valuep,insize,outptr,outlen);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode sasl_create_login_message(struct SessionHandle *data,
                                          const char *valuep, char **outptr,
                                          size_t *outlen)
{
  size_t vlen = strlen(valuep);

  if(!vlen) {
    /* Calculate an empty reply */
    *outptr = strdup("=");
    if(*outptr) {
      *outlen = (size_t) 1;
      return CURLE_OK;
    }

    *outlen = 0;
    return CURLE_OUT_OF_MEMORY;
  }

  /* Base64 encode the value */
  return Curl_base64_encode(data, valuep, vlen, outptr, outlen);
}